

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFSave<(moira::Instr)198,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)2,_2> local_3c;
  int local_28;
  byte local_23;
  u16 local_22;
  u8 dn;
  u32 *puStack_20;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_23 = (byte)op & 7;
  local_22 = op;
  puStack_20 = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  pSVar1 = StrWriter::operator<<(str);
  local_28 = addr_local[0xe];
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_28);
  Op<(moira::Mode)2,2>(&local_3c,this,(ushort)local_23,puStack_20);
  StrWriter::operator<<(pSVar1,&local_3c);
  return;
}

Assistant:

void
Moira::dasmFSave(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}